

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_parse_stream(App *this,istream *input)

{
  element_type *peVar1;
  App *in_RSI;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_00000018;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  App *in_stack_ffffffffffffffd0;
  undefined1 local_28 [16];
  pointer in_stack_ffffffffffffffe8;
  
  peVar1 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x413063);
  (*peVar1->_vptr_Config[1])(local_28,peVar1,in_RSI);
  _parse_config((App *)values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                       _M_impl.super__Vector_impl_data._M_start,in_stack_00000018);
  increment_parsed(in_stack_ffffffffffffffd0);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::size
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_28);
  _trigger_pre_parse(in_RSI,(size_t)in_stack_ffffffffffffffe8);
  _process(in_stack_ffffffffffffffd0);
  _process_extras((App *)values.
                         super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)in_stack_ffffffffffffffd0)
  ;
  return;
}

Assistant:

CLI11_INLINE void App::_parse_stream(std::istream &input) {
    auto values = config_formatter_->from_config(input);
    _parse_config(values);
    increment_parsed();
    _trigger_pre_parse(values.size());
    _process();

    // Throw error if any items are left over (depending on settings)
    _process_extras();
}